

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void * bind_with_context(http_context_t *ctx,void *ptr)

{
  nh_malloced_t *pnVar1;
  
  pnVar1 = (nh_malloced_t *)malloc(0x10);
  if (pnVar1 != (nh_malloced_t *)0x0) {
    pnVar1->ptr = (char *)ptr;
    pnVar1->next = ctx->malloced;
    ctx->malloced = pnVar1;
    return ptr;
  }
  __assert_fail("m != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                ,0x1c4,"void *bind_with_context(http_context_t *, void *)");
}

Assistant:

void *bind_with_context(http_context_t *ctx, void *ptr) {
    nh_malloced_t *m = (nh_malloced_t *) malloc(sizeof(nh_malloced_t));
    assert(m != NULL);
    m->ptr = ptr;
    m->next = ctx->malloced;
    ctx->malloced = m;
    return ptr;
}